

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall aeron::archive::AeronArchive::stopReplay(AeronArchive *this,int64_t replaySessionId)

{
  anon_class_16_2_122153d7 local_48;
  function<bool_(long)> local_38;
  int64_t local_18;
  int64_t replaySessionId_local;
  AeronArchive *this_local;
  
  local_48.replaySessionId = &local_18;
  local_48.this = this;
  local_18 = replaySessionId;
  replaySessionId_local = (int64_t)this;
  std::function<bool(long)>::function<aeron::archive::AeronArchive::stopReplay(long)::__0,void>
            ((function<bool(long)> *)&local_38,&local_48);
  callAndPollForResponse(this,&local_38,"stop replay");
  std::function<bool_(long)>::~function(&local_38);
  return;
}

Assistant:

void AeronArchive::stopReplay(std::int64_t replaySessionId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopReplay(replaySessionId, correlationId, controlSessionId_);
        },
        "stop replay");
}